

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O1

int lh_table_resize(lh_table *t,int new_size)

{
  int iVar1;
  lh_table *t_00;
  unsigned_long h;
  lh_entry *plVar2;
  
  t_00 = lh_table_new(new_size,(lh_entry_free_fn *)0x0,t->hash_fn,t->equal_fn);
  iVar1 = -1;
  if (t_00 != (lh_table *)0x0) {
    for (plVar2 = t->head; plVar2 != (lh_entry *)0x0; plVar2 = plVar2->next) {
      h = (*t_00->hash_fn)(plVar2->k);
      iVar1 = lh_table_insert_w_hash
                        (t_00,plVar2->k,plVar2->v,h,(uint)(plVar2->k_is_constant != 0) << 2);
      if (iVar1 != 0) {
        lh_table_free(t_00);
        return -1;
      }
    }
    free(t->table);
    t->table = t_00->table;
    t->size = new_size;
    t->head = t_00->head;
    t->tail = t_00->tail;
    free(t_00);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int lh_table_resize(struct lh_table *t, int new_size)
{
	struct lh_table *new_t;
	struct lh_entry *ent;

	new_t = lh_table_new(new_size, NULL, t->hash_fn, t->equal_fn);
	if (new_t == NULL)
		return -1;

	for (ent = t->head; ent != NULL; ent = ent->next)
	{
		unsigned long h = lh_get_hash(new_t, ent->k);
		unsigned int opts = 0;
		if (ent->k_is_constant)
			opts = JSON_C_OBJECT_ADD_CONSTANT_KEY;
		if (lh_table_insert_w_hash(new_t, ent->k, ent->v, h, opts) != 0)
		{
			lh_table_free(new_t);
			return -1;
		}
	}
	free(t->table);
	t->table = new_t->table;
	t->size = new_size;
	t->head = new_t->head;
	t->tail = new_t->tail;
	free(new_t);

	return 0;
}